

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlCharEncError UTF16LEToUTF8(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  xmlCharEncError xVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ushort *puVar11;
  byte *pbVar12;
  
  iVar10 = (int)out;
  iVar7 = (int)in;
  if (0 < (int)((long)*inlen & 0xfffffffffffffffeU)) {
    puVar11 = (ushort *)(in + ((long)*inlen & 0xfffffffffffffffeU));
    pbVar12 = out + *outlen;
    do {
      bVar1 = (byte)*(ushort *)in;
      bVar2 = *(byte *)((long)in + 1);
      uVar3 = *(ushort *)in;
      if (0x7f < uVar3) {
        if (bVar2 < 8) {
          if (1 < (long)pbVar12 - (long)out) {
            *out = (byte)(uVar3 >> 6) | 0xc0;
            out[1] = bVar1 & 0x3f | 0x80;
            lVar6 = 2;
            lVar9 = 2;
            goto LAB_0012a7c8;
          }
        }
        else if ((bVar2 & 0xf8) == 0xd8) {
          xVar5 = XML_ENC_ERR_INPUT;
          if ((bVar2 & 0xdc) != 0xd8) goto LAB_0012a81b;
          if ((long)puVar11 - (long)in < 4) break;
          if ((*(byte *)((long)in + 3) & 0xfc) != 0xdc) goto LAB_0012a81b;
          if (3 < (long)pbVar12 - (long)out) {
            uVar4 = *(ushort *)((long)in + 2);
            uVar8 = (uint)uVar3 * 0x400 + (uint)CONCAT11(*(byte *)((long)in + 3),(byte)uVar4) +
                    0xfca02400;
            *out = (byte)(uVar8 >> 0x12) | 0xf0;
            out[1] = (byte)(uVar8 >> 0xc) & 0x3f | 0x80;
            out[2] = (byte)(uVar8 >> 6) & 0x3f | 0x80;
            out[3] = (byte)uVar4 & 0x3f | 0x80;
            lVar6 = 4;
            lVar9 = 4;
            goto LAB_0012a7c8;
          }
        }
        else if (2 < (long)pbVar12 - (long)out) {
          *out = bVar2 >> 4 | 0xe0;
          out[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
          out[2] = bVar1 & 0x3f | 0x80;
          lVar9 = 3;
          goto LAB_0012a6d6;
        }
LAB_0012a816:
        xVar5 = XML_ENC_ERR_SPACE;
        goto LAB_0012a81b;
      }
      if (pbVar12 <= out) goto LAB_0012a816;
      *out = bVar1;
      lVar9 = 1;
LAB_0012a6d6:
      lVar6 = 2;
LAB_0012a7c8:
      in = (uchar *)((long)in + lVar6);
      out = out + lVar9;
    } while (in < puVar11);
  }
  xVar5 = (int)out - iVar10;
LAB_0012a81b:
  *outlen = (int)out - iVar10;
  *inlen = (int)in - iVar7;
  return xVar5;
}

Assistant:

static xmlCharEncError
UTF16LEToUTF8(void *vctxt ATTRIBUTE_UNUSED,
              unsigned char *out, int *outlen,
              const unsigned char *in, int *inlen,
              int flush ATTRIBUTE_UNUSED) {
    const unsigned char *instart = in;
    const unsigned char *inend = in + (*inlen & ~1);
    unsigned char *outstart = out;
    unsigned char *outend = out + *outlen;
    unsigned c, d;
    int ret = XML_ENC_ERR_SPACE;

    while (in < inend) {
        c = in[0] | (in[1] << 8);

        if (c < 0x80) {
            if (out >= outend)
                goto done;
            out[0] = c;
            in += 2;
            out += 1;
        } else if (c < 0x800) {
            if (outend - out < 2)
                goto done;
            out[0] = (c >> 6)   | 0xC0;
            out[1] = (c & 0x3F) | 0x80;
            in += 2;
            out += 2;
        } else if ((c & 0xF800) != 0xD800) {
            if (outend - out < 3)
                goto done;
            out[0] =  (c >> 12)         | 0xE0;
            out[1] = ((c >>  6) & 0x3F) | 0x80;
            out[2] =  (c        & 0x3F) | 0x80;
            in += 2;
            out += 3;
        } else {
            /* Surrogate pair */
            if ((c & 0xFC00) != 0xD800) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }
	    if (inend - in < 4)
		break;
            d = in[2] | (in[3] << 8);
            if ((d & 0xFC00) != 0xDC00) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }
	    if (outend - out < 4)
		goto done;
            c = (c << 10) + d - ((0xD800 << 10) + 0xDC00 - 0x10000);
            out[0] =  (c >> 18)         | 0xF0;
            out[1] = ((c >> 12) & 0x3F) | 0x80;
            out[2] = ((c >>  6) & 0x3F) | 0x80;
            out[3] =  (c        & 0x3F) | 0x80;
            in += 4;
            out += 4;
        }
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}